

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

HighsInt __thiscall HighsSymmetries::getOrbit(HighsSymmetries *this,HighsInt col)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  pointer piVar5;
  int iVar6;
  HighsInt i;
  
  lVar4 = (long)(this->columnPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[col];
  if (lVar4 == -1) {
    iVar6 = -1;
  }
  else {
    piVar2 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = piVar2[lVar4];
    lVar4 = (long)iVar6;
    if (iVar6 != piVar2[lVar4]) {
      do {
        std::vector<int,_std::allocator<int>_>::push_back(&this->linkCompressionStack,&i);
        piVar2 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = piVar2[(int)lVar4];
        lVar4 = (long)iVar6;
      } while (iVar6 != piVar2[lVar4]);
      piVar3 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        piVar1 = piVar5 + -1;
        piVar5 = piVar5 + -1;
        piVar2[*piVar1] = iVar6;
      } while (piVar5 != piVar3);
      (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar5;
    }
  }
  return iVar6;
}

Assistant:

HighsInt HighsSymmetries::getOrbit(HighsInt col) {
  HighsInt i = columnPosition[col];
  if (i == -1) return -1;
  HighsInt orbit = orbitPartition[i];
  if (orbit != orbitPartition[orbit]) {
    do {
      linkCompressionStack.push_back(i);
      i = orbit;
      orbit = orbitPartition[orbit];
    } while (orbit != orbitPartition[orbit]);

    do {
      i = linkCompressionStack.back();
      linkCompressionStack.pop_back();
      orbitPartition[i] = orbit;
    } while (!linkCompressionStack.empty());
  }

  return orbit;
}